

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_util.c
# Opt level: O2

int kvtree_util_get_ptr(kvtree *hash,char *key,void **val)

{
  int iVar1;
  void *in_RAX;
  char *pcVar2;
  void *val_tmp;
  
  val_tmp = in_RAX;
  pcVar2 = kvtree_get_val(hash,key);
  if ((pcVar2 != (char *)0x0) && (iVar1 = __isoc99_sscanf(pcVar2,"%p",&val_tmp), iVar1 == 1)) {
    *val = val_tmp;
    return 0;
  }
  return 1;
}

Assistant:

int kvtree_util_get_ptr(const kvtree* hash, const char* key, void** val)
{
  int rc = KVTREE_FAILURE;

  /* check whether this key is even set */
  char* val_str = kvtree_get_val(hash, key);
  if (val_str != NULL) {
    /* convert the key string */
    void* val_tmp;
    int sscanf_rc = sscanf(val_str, "%p", &val_tmp);
    if (sscanf_rc == 1) {
      *val = val_tmp;
      rc = KVTREE_SUCCESS;
    }
  }

  return rc;
}